

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder_tests.cpp
# Opt level: O1

void anon_unknown.dwarf_f869e::test_equal
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *v,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *expected)

{
  uchar uVar1;
  uchar uVar2;
  pointer puVar3;
  pointer puVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_f8;
  ITransientExpression local_e8;
  long *local_d8;
  char *local_d0;
  size_t sStack_c8;
  long *local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b0;
  long local_a8;
  StringRef local_a0;
  AssertionHandler local_90;
  long local_48;
  StringRef local_40;
  
  local_e8._vptr_ITransientExpression = (_func_int **)0x8189b6;
  local_e8.m_isBinaryExpression = true;
  local_e8.m_result = false;
  local_e8._10_6_ = 0;
  local_f8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_encoder_tests.cpp"
  ;
  local_f8.line = 0x14;
  Catch::StringRef::StringRef(&local_40,"v.size() == expected.size()");
  Catch::AssertionHandler::AssertionHandler
            (&local_90,(StringRef *)&local_e8,&local_f8,local_40,Normal);
  lVar5 = (long)(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start;
  local_b0 = expected;
  local_a8 = lVar5;
  local_48 = lVar6;
  Catch::StringRef::StringRef((StringRef *)&local_f8,"==");
  local_e8.m_result = lVar5 == lVar6;
  local_e8.m_isBinaryExpression = true;
  local_e8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b5a1f8;
  local_d8 = &local_a8;
  local_d0 = local_f8.file;
  sStack_c8 = local_f8.line;
  local_c0 = &local_48;
  Catch::AssertionHandler::handleExpr(&local_90,&local_e8);
  Catch::ITransientExpression::~ITransientExpression(&local_e8);
  Catch::AssertionHandler::complete(&local_90);
  if (local_90.m_completed == false) {
    (*(local_90.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if ((v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    local_b8 = v;
    do {
      local_e8._vptr_ITransientExpression = (_func_int **)0x8102c5;
      local_e8.m_isBinaryExpression = true;
      local_e8.m_result = false;
      local_e8._10_6_ = 0;
      local_f8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_encoder_tests.cpp"
      ;
      local_f8.line = 0x18;
      Catch::StringRef::StringRef(&local_a0,"v[i] == expected[i]");
      Catch::AssertionHandler::AssertionHandler
                (&local_90,(StringRef *)&local_e8,&local_f8,local_a0,ContinueOnFailure);
      puVar3 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = (local_b0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      uVar1 = puVar3[uVar7];
      uVar2 = puVar4[uVar7];
      Catch::StringRef::StringRef((StringRef *)&local_f8,"==");
      local_e8.m_result = uVar1 == uVar2;
      local_e8.m_isBinaryExpression = true;
      local_d8 = (long *)(puVar3 + uVar7);
      local_c0 = (long *)(puVar4 + uVar7);
      local_e8._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_00b5a238;
      local_d0 = local_f8.file;
      sStack_c8 = local_f8.line;
      Catch::AssertionHandler::handleExpr(&local_90,&local_e8);
      Catch::ITransientExpression::~ITransientExpression(&local_e8);
      Catch::AssertionHandler::complete(&local_90);
      v = local_b8;
      if (local_90.m_completed == false) {
        (*(local_90.m_resultCapture)->_vptr_IResultCapture[0xe])(local_90.m_resultCapture,&local_90)
        ;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(v->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(v->
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                                  ._M_impl.super__Vector_impl_data._M_start));
  }
  return;
}

Assistant:

void test_equal(const std::vector<uint8_t>& v, const std::vector<uint8_t>& expected)
    {
        REQUIRE(v.size() == expected.size());

        for (std::size_t i = 0; i < v.size(); ++i)
        {
            CHECK(v[i] == expected[i]);
        }
    }